

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
args::NamedBase::GetDescription
          (NamedBase *this,string *param_2,string *param_3,string *param_4,string *param_5)

{
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>_>_> *this_00;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>_>_> *this_01;
  long *in_RSI;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description;
  string local_58 [39];
  undefined1 local_31;
  
  local_31 = 0;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple<true,_true>((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x11a1d2);
  (**(code **)(*in_RSI + 0x28))(local_58);
  this_00 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x11a1f1);
  std::__cxx11::string::operator=((string *)this_00,local_58);
  std::__cxx11::string::~string(local_58);
  this_01 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x11a225);
  std::__cxx11::string::operator=((string *)this_01,(string *)(in_RSI + 2));
  return in_RDI;
}

Assistant:

virtual std::tuple<std::string, std::string> GetDescription(const std::string &, const std::string &, const std::string &, const std::string &) const override
            {
                std::tuple<std::string, std::string> description;
                std::get<0>(description) = Name();
                std::get<1>(description) = help;
                return description;
            }